

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  Ref<embree::Geometry> *pRVar3;
  Geometry *pGVar4;
  long lVar5;
  long lVar6;
  RTCIntersectArguments *pRVar7;
  bool bVar8;
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  byte bVar12;
  uint uVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  byte bVar21;
  uint uVar22;
  uint uVar23;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar24) [32];
  long lVar25;
  ulong uVar26;
  long lVar27;
  byte bVar28;
  RTCRayQueryContext *pRVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  ulong uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar74 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar91;
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [64];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  float fVar98;
  undefined1 auVar99 [16];
  undefined4 uVar100;
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined8 uVar103;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [64];
  undefined1 auVar107 [32];
  undefined1 auVar108 [64];
  undefined1 auVar109 [64];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar124;
  undefined1 auVar125 [64];
  undefined1 auVar126 [64];
  undefined1 auVar127 [64];
  undefined1 auVar128 [64];
  undefined1 auVar129 [64];
  undefined1 auVar130 [64];
  undefined1 auVar131 [64];
  undefined1 auVar132 [64];
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  int local_27c4;
  RayQueryContext *local_27c0;
  Scene *local_27b8;
  RTCFilterFunctionNArguments local_27b0;
  undefined1 local_2780 [32];
  Geometry *local_2760;
  ulong local_2758;
  ulong local_2750;
  ulong *local_2748;
  long local_2740;
  long local_2738;
  float local_2730;
  undefined4 local_272c;
  undefined4 local_2728;
  undefined4 local_2724;
  undefined4 local_2720;
  undefined4 local_271c;
  uint local_2718;
  uint local_2714;
  uint local_2710;
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  float local_2660;
  float fStack_265c;
  float fStack_2658;
  float fStack_2654;
  float fStack_2650;
  float fStack_264c;
  float fStack_2648;
  float fStack_2644;
  undefined1 local_2640 [32];
  undefined1 local_2620 [32];
  float local_2600;
  float fStack_25fc;
  float fStack_25f8;
  float fStack_25f4;
  float fStack_25f0;
  float fStack_25ec;
  float fStack_25e8;
  float fStack_25e4;
  undefined1 local_25e0 [32];
  undefined1 local_25c0 [32];
  undefined1 local_25a0 [32];
  undefined1 local_2580 [32];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  uint uStack_24a4;
  byte local_24a0;
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  float local_2420 [4];
  float fStack_2410;
  float fStack_240c;
  float fStack_2408;
  undefined4 uStack_2404;
  float local_2400 [4];
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  uint uStack_23e4;
  float local_23e0 [4];
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  uint uStack_23c4;
  undefined1 local_23c0;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  undefined1 auVar73 [32];
  
  local_23a0 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_23a0 != 8) {
    local_2748 = local_2390;
    local_2398[0] = 0;
    aVar2 = (ray->super_RayK<1>).dir.field_0;
    auVar66 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar98 = (ray->super_RayK<1>).tfar;
    auVar96 = ZEXT464((uint)fVar98);
    auVar42._8_4_ = 0x7fffffff;
    auVar42._0_8_ = 0x7fffffff7fffffff;
    auVar42._12_4_ = 0x7fffffff;
    auVar42 = vandps_avx512vl((undefined1  [16])aVar2,auVar42);
    auVar54 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar98));
    auVar43._8_4_ = 0x219392ef;
    auVar43._0_8_ = 0x219392ef219392ef;
    auVar43._12_4_ = 0x219392ef;
    uVar26 = vcmpps_avx512vl(auVar42,auVar43,1);
    auVar63._8_4_ = 0x3f800000;
    auVar63._0_8_ = 0x3f8000003f800000;
    auVar63._12_4_ = 0x3f800000;
    auVar42 = vdivps_avx(auVar63,(undefined1  [16])aVar2);
    auVar43 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar8 = (bool)((byte)uVar26 & 1);
    auVar50._0_4_ = (uint)bVar8 * auVar43._0_4_ | (uint)!bVar8 * auVar42._0_4_;
    bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
    auVar50._4_4_ = (uint)bVar8 * auVar43._4_4_ | (uint)!bVar8 * auVar42._4_4_;
    bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
    auVar50._8_4_ = (uint)bVar8 * auVar43._8_4_ | (uint)!bVar8 * auVar42._8_4_;
    bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
    auVar50._12_4_ = (uint)bVar8 * auVar43._12_4_ | (uint)!bVar8 * auVar42._12_4_;
    auVar44._8_4_ = 0x3f7ffffa;
    auVar44._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar44._12_4_ = 0x3f7ffffa;
    auVar44 = vmulps_avx512vl(auVar50,auVar44);
    auVar45._8_4_ = 0x3f800003;
    auVar45._0_8_ = 0x3f8000033f800003;
    auVar45._12_4_ = 0x3f800003;
    auVar45 = vmulps_avx512vl(auVar50,auVar45);
    uVar100 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
    local_25a0._4_4_ = uVar100;
    local_25a0._0_4_ = uVar100;
    local_25a0._8_4_ = uVar100;
    local_25a0._12_4_ = uVar100;
    local_25a0._16_4_ = uVar100;
    local_25a0._20_4_ = uVar100;
    local_25a0._24_4_ = uVar100;
    local_25a0._28_4_ = uVar100;
    auVar106 = ZEXT3264(local_25a0);
    uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
    local_25c0._4_4_ = uVar100;
    local_25c0._0_4_ = uVar100;
    local_25c0._8_4_ = uVar100;
    local_25c0._12_4_ = uVar100;
    local_25c0._16_4_ = uVar100;
    local_25c0._20_4_ = uVar100;
    local_25c0._24_4_ = uVar100;
    local_25c0._28_4_ = uVar100;
    auVar108 = ZEXT3264(local_25c0);
    uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
    local_25e0._4_4_ = uVar100;
    local_25e0._0_4_ = uVar100;
    local_25e0._8_4_ = uVar100;
    local_25e0._12_4_ = uVar100;
    local_25e0._16_4_ = uVar100;
    local_25e0._20_4_ = uVar100;
    local_25e0._24_4_ = uVar100;
    local_25e0._28_4_ = uVar100;
    auVar109 = ZEXT3264(local_25e0);
    fVar98 = auVar44._0_4_;
    auVar42 = vmovshdup_avx(auVar44);
    uVar103 = auVar42._0_8_;
    local_2620._8_8_ = uVar103;
    local_2620._0_8_ = uVar103;
    local_2620._16_8_ = uVar103;
    local_2620._24_8_ = uVar103;
    auVar116 = ZEXT3264(local_2620);
    auVar43 = vshufpd_avx(auVar44,auVar44,1);
    auVar69._8_4_ = 2;
    auVar69._0_8_ = 0x200000002;
    auVar69._12_4_ = 2;
    auVar69._16_4_ = 2;
    auVar69._20_4_ = 2;
    auVar69._24_4_ = 2;
    auVar69._28_4_ = 2;
    local_2640 = vpermps_avx2(auVar69,ZEXT1632(auVar44));
    auVar118 = ZEXT3264(local_2640);
    auVar68._8_4_ = 1;
    auVar68._0_8_ = 0x100000001;
    auVar68._12_4_ = 1;
    auVar68._16_4_ = 1;
    auVar68._20_4_ = 1;
    auVar68._24_4_ = 1;
    auVar68._28_4_ = 1;
    fVar91 = auVar45._0_4_;
    local_2680 = vpermps_avx512vl(auVar68,ZEXT1632(auVar45));
    auVar125 = ZEXT3264(local_2680);
    local_26a0 = vpermps_avx512vl(auVar69,ZEXT1632(auVar45));
    auVar126 = ZEXT3264(local_26a0);
    uVar26 = (ulong)(fVar98 < 0.0) << 5;
    uVar36 = (ulong)(auVar42._0_4_ < 0.0) << 5 | 0x40;
    uVar32 = (ulong)(auVar43._0_4_ < 0.0) << 5 | 0x80;
    uVar38 = uVar26 ^ 0x20;
    uVar40 = uVar36 ^ 0x20;
    local_26c0 = vbroadcastss_avx512vl(auVar66);
    auVar127 = ZEXT3264(local_26c0);
    uVar100 = auVar54._0_4_;
    auVar94 = ZEXT3264(CONCAT428(uVar100,CONCAT424(uVar100,CONCAT420(uVar100,CONCAT416(uVar100,
                                                  CONCAT412(uVar100,CONCAT48(uVar100,CONCAT44(
                                                  uVar100,uVar100))))))));
    auVar68 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar128 = ZEXT3264(auVar68);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0xfffffff8));
    auVar129 = ZEXT3264(auVar68);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar130 = ZEXT3264(auVar68);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar131 = ZEXT3264(auVar68);
    auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar132 = ZEXT3264(auVar68);
    local_27c0 = context;
    local_2750 = uVar26;
    local_2600 = fVar98;
    fStack_25fc = fVar98;
    fStack_25f8 = fVar98;
    fStack_25f4 = fVar98;
    fStack_25f0 = fVar98;
    fStack_25ec = fVar98;
    fStack_25e8 = fVar98;
    fStack_25e4 = fVar98;
    local_2660 = fVar91;
    fStack_265c = fVar91;
    fStack_2658 = fVar91;
    fStack_2654 = fVar91;
    fStack_2650 = fVar91;
    fStack_264c = fVar91;
    fStack_2648 = fVar91;
    fStack_2644 = fVar91;
    local_2758 = uVar36;
    fVar110 = fVar98;
    fVar111 = fVar98;
    fVar112 = fVar98;
    fVar113 = fVar98;
    fVar114 = fVar98;
    fVar115 = fVar98;
    fVar119 = fVar91;
    fVar120 = fVar91;
    fVar121 = fVar91;
    fVar122 = fVar91;
    fVar123 = fVar91;
    fVar124 = fVar91;
    do {
      pfVar1 = (float *)(local_2748 + -1);
      local_2748 = local_2748 + -2;
      if (*pfVar1 <= auVar96._0_4_) {
        uVar39 = *local_2748;
        while( true ) {
          if ((uVar39 & 8) != 0) break;
          pauVar24 = (undefined1 (*) [32])(uVar39 & 0xfffffffffffffff0);
          uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar97._4_4_ = uVar100;
          auVar97._0_4_ = uVar100;
          auVar97._8_4_ = uVar100;
          auVar97._12_4_ = uVar100;
          auVar97._16_4_ = uVar100;
          auVar97._20_4_ = uVar100;
          auVar97._24_4_ = uVar100;
          auVar97._28_4_ = uVar100;
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar26),auVar97,
                                    *(undefined1 (*) [32])(pauVar24[2] + uVar26));
          auVar74 = auVar106._0_32_;
          auVar68 = vsubps_avx(ZEXT1632(auVar42),auVar74);
          auVar16._4_4_ = fVar110 * auVar68._4_4_;
          auVar16._0_4_ = fVar98 * auVar68._0_4_;
          auVar16._8_4_ = fVar111 * auVar68._8_4_;
          auVar16._12_4_ = fVar112 * auVar68._12_4_;
          auVar16._16_4_ = fVar113 * auVar68._16_4_;
          auVar16._20_4_ = fVar114 * auVar68._20_4_;
          auVar16._24_4_ = fVar115 * auVar68._24_4_;
          auVar16._28_4_ = auVar68._28_4_;
          auVar69 = vmaxps_avx512vl(auVar127._0_32_,auVar16);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar36),auVar97,
                                    *(undefined1 (*) [32])(pauVar24[2] + uVar36));
          auVar88 = auVar108._0_32_;
          auVar68 = vsubps_avx(ZEXT1632(auVar42),auVar88);
          auVar17._4_4_ = auVar116._4_4_ * auVar68._4_4_;
          auVar17._0_4_ = auVar116._0_4_ * auVar68._0_4_;
          auVar17._8_4_ = auVar116._8_4_ * auVar68._8_4_;
          auVar17._12_4_ = auVar116._12_4_ * auVar68._12_4_;
          auVar17._16_4_ = auVar116._16_4_ * auVar68._16_4_;
          auVar17._20_4_ = auVar116._20_4_ * auVar68._20_4_;
          auVar17._24_4_ = auVar116._24_4_ * auVar68._24_4_;
          auVar17._28_4_ = auVar68._28_4_;
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar32),auVar97,
                                    *(undefined1 (*) [32])(pauVar24[2] + uVar32));
          auVar87 = auVar109._0_32_;
          auVar68 = vsubps_avx(ZEXT1632(auVar42),auVar87);
          auVar18._4_4_ = auVar118._4_4_ * auVar68._4_4_;
          auVar18._0_4_ = auVar118._0_4_ * auVar68._0_4_;
          auVar18._8_4_ = auVar118._8_4_ * auVar68._8_4_;
          auVar18._12_4_ = auVar118._12_4_ * auVar68._12_4_;
          auVar18._16_4_ = auVar118._16_4_ * auVar68._16_4_;
          auVar18._20_4_ = auVar118._20_4_ * auVar68._20_4_;
          auVar18._24_4_ = auVar118._24_4_ * auVar68._24_4_;
          auVar18._28_4_ = auVar68._28_4_;
          auVar68 = vmaxps_avx(auVar17,auVar18);
          auVar68 = vmaxps_avx(auVar69,auVar68);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar38),auVar97,
                                    *(undefined1 (*) [32])(pauVar24[2] + uVar38));
          auVar69 = vsubps_avx(ZEXT1632(auVar42),auVar74);
          auVar19._4_4_ = fVar119 * auVar69._4_4_;
          auVar19._0_4_ = fVar91 * auVar69._0_4_;
          auVar19._8_4_ = fVar120 * auVar69._8_4_;
          auVar19._12_4_ = fVar121 * auVar69._12_4_;
          auVar19._16_4_ = fVar122 * auVar69._16_4_;
          auVar19._20_4_ = fVar123 * auVar69._20_4_;
          auVar19._24_4_ = fVar124 * auVar69._24_4_;
          auVar19._28_4_ = auVar69._28_4_;
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + uVar40),auVar97,
                                    *(undefined1 (*) [32])(pauVar24[2] + uVar40));
          auVar69 = vsubps_avx(ZEXT1632(auVar42),auVar88);
          auVar70 = vmulps_avx512vl(auVar125._0_32_,auVar69);
          auVar42 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar24[8] + (uVar32 ^ 0x20)),auVar97,
                                    *(undefined1 (*) [32])(pauVar24[2] + (uVar32 ^ 0x20)));
          auVar69 = vsubps_avx(ZEXT1632(auVar42),auVar87);
          auVar69 = vmulps_avx512vl(auVar126._0_32_,auVar69);
          auVar69 = vminps_avx(auVar70,auVar69);
          auVar70 = vminps_avx(auVar94._0_32_,auVar19);
          auVar69 = vminps_avx(auVar70,auVar69);
          uVar41 = vcmpps_avx512vl(auVar68,auVar69,2);
          if (((uint)uVar39 & 7) == 6) {
            uVar39 = vcmpps_avx512vl(auVar97,pauVar24[0xe],0xd);
            uVar35 = vcmpps_avx512vl(auVar97,pauVar24[0xf],1);
            uVar41 = uVar41 & uVar39 & uVar35;
          }
          bVar21 = (byte)uVar41;
          if (bVar21 == 0) {
            auVar42 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar96 = ZEXT1664(auVar42);
            goto LAB_01f2b6f3;
          }
          auVar69 = *pauVar24;
          auVar70 = pauVar24[1];
          auVar71 = vmovdqa64_avx512vl(auVar128._0_32_);
          auVar71 = vpternlogd_avx512vl(auVar71,auVar68,auVar129._0_32_,0xf8);
          auVar72 = vpcompressd_avx512vl(auVar71);
          auVar73._0_4_ =
               (uint)(bVar21 & 1) * auVar72._0_4_ | (uint)!(bool)(bVar21 & 1) * auVar71._0_4_;
          bVar8 = (bool)((byte)(uVar41 >> 1) & 1);
          auVar73._4_4_ = (uint)bVar8 * auVar72._4_4_ | (uint)!bVar8 * auVar71._4_4_;
          bVar8 = (bool)((byte)(uVar41 >> 2) & 1);
          auVar73._8_4_ = (uint)bVar8 * auVar72._8_4_ | (uint)!bVar8 * auVar71._8_4_;
          bVar8 = (bool)((byte)(uVar41 >> 3) & 1);
          auVar73._12_4_ = (uint)bVar8 * auVar72._12_4_ | (uint)!bVar8 * auVar71._12_4_;
          bVar8 = (bool)((byte)(uVar41 >> 4) & 1);
          auVar73._16_4_ = (uint)bVar8 * auVar72._16_4_ | (uint)!bVar8 * auVar71._16_4_;
          bVar8 = (bool)((byte)(uVar41 >> 5) & 1);
          auVar73._20_4_ = (uint)bVar8 * auVar72._20_4_ | (uint)!bVar8 * auVar71._20_4_;
          bVar8 = (bool)((byte)(uVar41 >> 6) & 1);
          auVar73._24_4_ = (uint)bVar8 * auVar72._24_4_ | (uint)!bVar8 * auVar71._24_4_;
          bVar8 = SUB81(uVar41 >> 7,0);
          auVar73._28_4_ = (uint)bVar8 * auVar72._28_4_ | (uint)!bVar8 * auVar71._28_4_;
          auVar71 = vpermt2q_avx512vl(auVar69,auVar73,auVar70);
          uVar39 = auVar71._0_8_;
          bVar21 = bVar21 - 1 & bVar21;
          if (bVar21 != 0) {
            auVar71 = vpshufd_avx2(auVar73,0x55);
            vpermt2q_avx512vl(auVar69,auVar71,auVar70);
            auVar72 = vpminsd_avx2(auVar73,auVar71);
            auVar71 = vpmaxsd_avx2(auVar73,auVar71);
            bVar21 = bVar21 - 1 & bVar21;
            if (bVar21 == 0) {
              auVar74 = vpermi2q_avx512vl(auVar72,auVar69,auVar70);
              uVar39 = auVar74._0_8_;
              auVar69 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
              *local_2748 = auVar69._0_8_;
              auVar68 = vpermd_avx2(auVar71,auVar68);
              *(int *)(local_2748 + 1) = auVar68._0_4_;
              local_2748 = local_2748 + 2;
            }
            else {
              auVar80 = vpshufd_avx2(auVar73,0xaa);
              vpermt2q_avx512vl(auVar69,auVar80,auVar70);
              auVar78 = vpminsd_avx2(auVar72,auVar80);
              auVar72 = vpmaxsd_avx2(auVar72,auVar80);
              auVar80 = vpminsd_avx2(auVar71,auVar72);
              auVar71 = vpmaxsd_avx2(auVar71,auVar72);
              bVar21 = bVar21 - 1 & bVar21;
              if (bVar21 == 0) {
                auVar74 = vpermi2q_avx512vl(auVar78,auVar69,auVar70);
                uVar39 = auVar74._0_8_;
                auVar74 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
                *local_2748 = auVar74._0_8_;
                auVar74 = vpermd_avx2(auVar71,auVar68);
                *(int *)(local_2748 + 1) = auVar74._0_4_;
                auVar69 = vpermt2q_avx512vl(auVar69,auVar80,auVar70);
                local_2748[2] = auVar69._0_8_;
                auVar68 = vpermd_avx2(auVar80,auVar68);
                *(int *)(local_2748 + 3) = auVar68._0_4_;
                local_2748 = local_2748 + 4;
              }
              else {
                auVar75 = vmovdqa64_avx512vl(auVar128._0_32_);
                auVar72 = vpshufd_avx2(auVar73,0xff);
                vpermt2q_avx512vl(auVar69,auVar72,auVar70);
                auVar77 = vpminsd_avx2(auVar78,auVar72);
                auVar72 = vpmaxsd_avx2(auVar78,auVar72);
                auVar78 = vpminsd_avx2(auVar80,auVar72);
                auVar72 = vpmaxsd_avx2(auVar80,auVar72);
                auVar80 = vpminsd_avx2(auVar71,auVar72);
                auVar71 = vpmaxsd_avx2(auVar71,auVar72);
                bVar21 = bVar21 - 1 & bVar21;
                if (bVar21 == 0) {
                  auVar72 = vpermi2q_avx512vl(auVar77,auVar69,auVar70);
                  uVar39 = auVar72._0_8_;
                  auVar72 = vpermt2q_avx512vl(auVar69,auVar71,auVar70);
                  *local_2748 = auVar72._0_8_;
                  auVar71 = vpermd_avx2(auVar71,auVar68);
                  *(int *)(local_2748 + 1) = auVar71._0_4_;
                  auVar71 = vpermt2q_avx512vl(auVar69,auVar80,auVar70);
                  local_2748[2] = auVar71._0_8_;
                  auVar71 = vpermd_avx2(auVar80,auVar68);
                  *(int *)(local_2748 + 3) = auVar71._0_4_;
                  auVar69 = vpermt2q_avx512vl(auVar69,auVar78,auVar70);
                  local_2748[4] = auVar69._0_8_;
                  auVar68 = vpermd_avx2(auVar78,auVar68);
                  *(int *)(local_2748 + 5) = auVar68._0_4_;
                  local_2748 = local_2748 + 6;
                }
                else {
                  auVar76 = valignd_avx512vl(auVar73,auVar73,3);
                  auVar72 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar77 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar72,auVar77);
                  auVar72 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar78 = vpermt2d_avx512vl(auVar77,auVar72,auVar78);
                  auVar78 = vpermt2d_avx512vl(auVar78,auVar72,auVar80);
                  auVar72 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar71 = vpermt2d_avx512vl(auVar78,auVar72,auVar71);
                  auVar96 = ZEXT3264(auVar71);
                  bVar28 = bVar21;
                  do {
                    auVar72 = auVar96._0_32_;
                    auVar101._8_4_ = 1;
                    auVar101._0_8_ = 0x100000001;
                    auVar101._12_4_ = 1;
                    auVar101._16_4_ = 1;
                    auVar101._20_4_ = 1;
                    auVar101._24_4_ = 1;
                    auVar101._28_4_ = 1;
                    auVar71 = vpermd_avx2(auVar101,auVar76);
                    auVar76 = valignd_avx512vl(auVar76,auVar76,1);
                    vpermt2q_avx512vl(auVar69,auVar76,auVar70);
                    bVar28 = bVar28 - 1 & bVar28;
                    uVar103 = vpcmpd_avx512vl(auVar71,auVar72,5);
                    auVar71 = vpmaxsd_avx2(auVar71,auVar72);
                    bVar12 = (byte)uVar103 << 1;
                    auVar72 = valignd_avx512vl(auVar72,auVar72,7);
                    bVar8 = (bool)((byte)uVar103 & 1);
                    auVar79._4_4_ = (uint)bVar8 * auVar72._4_4_ | (uint)!bVar8 * auVar71._4_4_;
                    auVar79._0_4_ = auVar71._0_4_;
                    bVar8 = (bool)(bVar12 >> 2 & 1);
                    auVar79._8_4_ = (uint)bVar8 * auVar72._8_4_ | (uint)!bVar8 * auVar71._8_4_;
                    bVar8 = (bool)(bVar12 >> 3 & 1);
                    auVar79._12_4_ = (uint)bVar8 * auVar72._12_4_ | (uint)!bVar8 * auVar71._12_4_;
                    bVar8 = (bool)(bVar12 >> 4 & 1);
                    auVar79._16_4_ = (uint)bVar8 * auVar72._16_4_ | (uint)!bVar8 * auVar71._16_4_;
                    bVar8 = (bool)(bVar12 >> 5 & 1);
                    auVar79._20_4_ = (uint)bVar8 * auVar72._20_4_ | (uint)!bVar8 * auVar71._20_4_;
                    bVar8 = (bool)(bVar12 >> 6 & 1);
                    auVar79._24_4_ = (uint)bVar8 * auVar72._24_4_ | (uint)!bVar8 * auVar71._24_4_;
                    auVar79._28_4_ =
                         (uint)(bVar12 >> 7) * auVar72._28_4_ |
                         (uint)!(bool)(bVar12 >> 7) * auVar71._28_4_;
                    auVar96 = ZEXT3264(auVar79);
                  } while (bVar28 != 0);
                  lVar25 = (ulong)(uint)POPCOUNT((uint)bVar21) + 3;
                  do {
                    auVar71 = vpermi2q_avx512vl(auVar79,auVar69,auVar70);
                    *local_2748 = auVar71._0_8_;
                    auVar72 = auVar96._0_32_;
                    auVar71 = vpermd_avx2(auVar72,auVar68);
                    *(int *)(local_2748 + 1) = auVar71._0_4_;
                    auVar79 = valignd_avx512vl(auVar72,auVar72,1);
                    local_2748 = local_2748 + 2;
                    auVar96 = ZEXT3264(auVar79);
                    lVar25 = lVar25 + -1;
                  } while (lVar25 != 0);
                  auVar68 = vpermt2q_avx512vl(auVar69,auVar79,auVar70);
                  uVar39 = auVar68._0_8_;
                }
                auVar106 = ZEXT3264(auVar74);
                auVar108 = ZEXT3264(auVar88);
                auVar109 = ZEXT3264(auVar87);
                auVar116 = ZEXT3264(auVar116._0_32_);
                auVar118 = ZEXT3264(auVar118._0_32_);
                auVar125 = ZEXT3264(auVar125._0_32_);
                auVar126 = ZEXT3264(auVar126._0_32_);
                auVar127 = ZEXT3264(auVar127._0_32_);
                auVar68 = vmovdqa64_avx512vl(auVar75);
                auVar128 = ZEXT3264(auVar68);
                auVar129 = ZEXT3264(auVar129._0_32_);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                auVar130 = ZEXT3264(auVar68);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                auVar131 = ZEXT3264(auVar68);
                auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                auVar132 = ZEXT3264(auVar68);
              }
            }
          }
        }
        local_2740 = (ulong)((uint)uVar39 & 0xf) - 8;
        if (local_2740 != 0) {
          uVar39 = uVar39 & 0xfffffffffffffff0;
          local_27b8 = local_27c0->scene;
          local_2738 = 0;
          do {
            lVar34 = local_2738 * 0x60;
            pRVar3 = (local_27b8->geometries).items;
            local_2780._0_8_ = pRVar3;
            pGVar4 = pRVar3[*(uint *)(uVar39 + 0x40 + lVar34)].ptr;
            fVar98 = (pGVar4->time_range).lower;
            fVar98 = pGVar4->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar98) /
                     ((pGVar4->time_range).upper - fVar98));
            auVar42 = vroundss_avx(ZEXT416((uint)fVar98),ZEXT416((uint)fVar98),9);
            auVar42 = vminss_avx(auVar42,ZEXT416((uint)(pGVar4->fnumTimeSegments + -1.0)));
            auVar9 = vmaxss_avx(ZEXT816(0),auVar42);
            iVar33 = (int)auVar9._0_4_;
            lVar31 = (long)iVar33 * 0x38;
            lVar25 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar31);
            auVar42 = *(undefined1 (*) [16])(lVar25 + (ulong)*(uint *)(uVar39 + lVar34) * 4);
            uVar36 = (ulong)*(uint *)(uVar39 + 0x10 + lVar34);
            auVar66 = *(undefined1 (*) [16])(lVar25 + uVar36 * 4);
            uVar41 = (ulong)*(uint *)(uVar39 + 0x20 + lVar34);
            auVar54 = *(undefined1 (*) [16])(lVar25 + uVar41 * 4);
            uVar35 = (ulong)*(uint *)(uVar39 + 0x30 + lVar34);
            auVar43 = *(undefined1 (*) [16])(lVar25 + uVar35 * 4);
            uVar26 = (ulong)*(uint *)(uVar39 + 4 + lVar34);
            lVar27 = (long)(iVar33 + 1) * 0x38;
            lVar25 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar27);
            auVar44 = *(undefined1 (*) [16])(lVar25 + (ulong)*(uint *)(uVar39 + lVar34) * 4);
            auVar45 = *(undefined1 (*) [16])(lVar25 + uVar36 * 4);
            lVar5 = *(long *)&pRVar3[*(uint *)(uVar39 + 0x44 + lVar34)].ptr[2].numPrimitives;
            local_2700._0_8_ = lVar31;
            lVar6 = *(long *)(lVar5 + lVar31);
            auVar50 = *(undefined1 (*) [16])(lVar6 + uVar26 * 4);
            auVar63 = *(undefined1 (*) [16])(lVar25 + uVar41 * 4);
            uVar41 = (ulong)*(uint *)(uVar39 + 0x14 + lVar34);
            auVar52 = *(undefined1 (*) [16])(lVar6 + uVar41 * 4);
            auVar65 = *(undefined1 (*) [16])(lVar25 + uVar35 * 4);
            uVar36 = (ulong)*(uint *)(uVar39 + 0x24 + lVar34);
            auVar56 = *(undefined1 (*) [16])(lVar6 + uVar36 * 4);
            uVar37 = (ulong)*(uint *)(uVar39 + 0x34 + lVar34);
            auVar58 = *(undefined1 (*) [16])(lVar6 + uVar37 * 4);
            lVar25 = *(long *)&pRVar3[*(uint *)(uVar39 + 0x48 + lVar34)].ptr[2].numPrimitives;
            lVar5 = *(long *)(lVar5 + lVar27);
            auVar60 = *(undefined1 (*) [16])(lVar5 + uVar26 * 4);
            lVar6 = *(long *)(lVar25 + lVar31);
            auVar61 = *(undefined1 (*) [16])(lVar5 + uVar41 * 4);
            uVar35 = (ulong)*(uint *)(uVar39 + 8 + lVar34);
            auVar47 = *(undefined1 (*) [16])(lVar6 + uVar35 * 4);
            auVar64 = *(undefined1 (*) [16])(lVar5 + uVar36 * 4);
            uVar26 = (ulong)*(uint *)(uVar39 + 0x18 + lVar34);
            auVar51 = *(undefined1 (*) [16])(lVar6 + uVar26 * 4);
            auVar67 = *(undefined1 (*) [16])(lVar5 + uVar37 * 4);
            uVar41 = (ulong)*(uint *)(uVar39 + 0x28 + lVar34);
            auVar55 = *(undefined1 (*) [16])(lVar6 + uVar41 * 4);
            uVar37 = (ulong)*(uint *)(uVar39 + 0x38 + lVar34);
            auVar57 = *(undefined1 (*) [16])(lVar6 + uVar37 * 4);
            lVar25 = *(long *)(lVar25 + lVar27);
            auVar59 = *(undefined1 (*) [16])(lVar25 + uVar35 * 4);
            lVar5 = *(long *)&pRVar3[*(uint *)(uVar39 + 0x4c + lVar34)].ptr[2].numPrimitives;
            lVar6 = *(long *)(lVar5 + lVar31);
            auVar62 = *(undefined1 (*) [16])(lVar25 + uVar26 * 4);
            uVar36 = (ulong)*(uint *)(uVar39 + 0xc + lVar34);
            auVar49 = *(undefined1 (*) [16])(lVar6 + uVar36 * 4);
            auVar99 = *(undefined1 (*) [16])(lVar25 + uVar41 * 4);
            uVar35 = (ulong)*(uint *)(uVar39 + 0x1c + lVar34);
            auVar53 = *(undefined1 (*) [16])(lVar6 + uVar35 * 4);
            auVar46 = vunpcklps_avx512vl(auVar42,auVar47);
            auVar47 = vunpckhps_avx512vl(auVar42,auVar47);
            auVar48 = vunpcklps_avx512vl(auVar50,auVar49);
            auVar50 = vunpckhps_avx(auVar50,auVar49);
            auVar42 = *(undefined1 (*) [16])(lVar25 + uVar37 * 4);
            uVar26 = (ulong)*(uint *)(uVar39 + 0x2c + lVar34);
            auVar47 = vunpcklps_avx(auVar47,auVar50);
            auVar49 = vunpcklps_avx512vl(auVar46,auVar48);
            auVar46 = vunpckhps_avx512vl(auVar46,auVar48);
            auVar50 = vunpcklps_avx512vl(auVar66,auVar51);
            auVar51 = vunpckhps_avx512vl(auVar66,auVar51);
            auVar48 = vunpcklps_avx512vl(auVar52,auVar53);
            auVar52 = vunpckhps_avx512vl(auVar52,auVar53);
            auVar66 = *(undefined1 (*) [16])(lVar6 + uVar26 * 4);
            uVar41 = (ulong)*(uint *)(uVar39 + 0x3c + lVar34);
            auVar52 = vunpcklps_avx(auVar51,auVar52);
            auVar51 = vunpcklps_avx512vl(auVar50,auVar48);
            auVar50 = vunpckhps_avx(auVar50,auVar48);
            auVar53 = vunpcklps_avx512vl(auVar54,auVar55);
            auVar54 = vunpckhps_avx512vl(auVar54,auVar55);
            auVar55 = vunpcklps_avx512vl(auVar56,auVar66);
            auVar56 = vunpckhps_avx512vl(auVar56,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar6 + uVar41 * 4);
            lVar25 = *(long *)(lVar5 + lVar27);
            auVar56 = vunpcklps_avx(auVar54,auVar56);
            auVar48 = vunpcklps_avx512vl(auVar53,auVar55);
            auVar54 = vunpckhps_avx(auVar53,auVar55);
            auVar55 = vunpcklps_avx512vl(auVar43,auVar57);
            auVar43 = vunpckhps_avx512vl(auVar43,auVar57);
            auVar57 = vunpcklps_avx512vl(auVar58,auVar66);
            auVar58 = vunpckhps_avx512vl(auVar58,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar25 + uVar36 * 4);
            auVar43 = vunpcklps_avx(auVar43,auVar58);
            auVar58 = vunpcklps_avx512vl(auVar55,auVar57);
            auVar55 = vunpckhps_avx512vl(auVar55,auVar57);
            auVar57 = vunpcklps_avx512vl(auVar44,auVar59);
            auVar44 = vunpckhps_avx512vl(auVar44,auVar59);
            auVar59 = vunpcklps_avx512vl(auVar60,auVar66);
            auVar60 = vunpckhps_avx512vl(auVar60,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar25 + uVar35 * 4);
            auVar60 = vunpcklps_avx512vl(auVar44,auVar60);
            auVar53 = vunpcklps_avx512vl(auVar57,auVar59);
            auVar57 = vunpckhps_avx512vl(auVar57,auVar59);
            auVar59 = vunpcklps_avx512vl(auVar45,auVar62);
            auVar44 = vunpckhps_avx512vl(auVar45,auVar62);
            auVar45 = vunpcklps_avx512vl(auVar61,auVar66);
            auVar61 = vunpckhps_avx512vl(auVar61,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar25 + uVar26 * 4);
            auVar44 = vunpcklps_avx(auVar44,auVar61);
            auVar61 = vunpcklps_avx512vl(auVar59,auVar45);
            auVar59 = vunpckhps_avx512vl(auVar59,auVar45);
            auVar62 = vunpcklps_avx512vl(auVar63,auVar99);
            auVar45 = vunpckhps_avx512vl(auVar63,auVar99);
            auVar63 = vunpcklps_avx512vl(auVar64,auVar66);
            auVar64 = vunpckhps_avx512vl(auVar64,auVar66);
            auVar66 = *(undefined1 (*) [16])(lVar25 + uVar41 * 4);
            auVar45 = vunpcklps_avx(auVar45,auVar64);
            auVar64 = vunpcklps_avx512vl(auVar62,auVar63);
            auVar63 = vunpckhps_avx512vl(auVar62,auVar63);
            auVar62 = vunpcklps_avx512vl(auVar65,auVar42);
            auVar42 = vunpckhps_avx512vl(auVar65,auVar42);
            auVar65 = vunpcklps_avx512vl(auVar67,auVar66);
            auVar66 = vunpckhps_avx512vl(auVar67,auVar66);
            auVar42 = vunpcklps_avx(auVar42,auVar66);
            auVar67 = vunpcklps_avx512vl(auVar62,auVar65);
            auVar65 = vunpckhps_avx512vl(auVar62,auVar65);
            auVar66 = ZEXT416((uint)(fVar98 - auVar9._0_4_));
            auVar62 = vbroadcastss_avx512vl(auVar66);
            auVar66 = vsubss_avx512f(ZEXT416(0x3f800000),auVar66);
            auVar99._0_4_ = auVar66._0_4_;
            auVar99._4_4_ = auVar99._0_4_;
            auVar99._8_4_ = auVar99._0_4_;
            auVar99._12_4_ = auVar99._0_4_;
            auVar66 = vmulps_avx512vl(auVar62,auVar53);
            auVar49 = vfmadd231ps_avx512vl(auVar66,auVar99,auVar49);
            auVar66 = vmulps_avx512vl(auVar62,auVar57);
            auVar57 = vfmadd231ps_avx512vl(auVar66,auVar99,auVar46);
            auVar66 = vmulps_avx512vl(auVar62,auVar60);
            auVar66 = vfmadd231ps_fma(auVar66,auVar99,auVar47);
            auVar60 = vmulps_avx512vl(auVar62,auVar61);
            auVar61 = vmulps_avx512vl(auVar62,auVar59);
            auVar47 = vmulps_avx512vl(auVar62,auVar44);
            auVar60 = vfmadd231ps_avx512vl(auVar60,auVar99,auVar51);
            auVar44 = vfmadd231ps_fma(auVar61,auVar99,auVar50);
            auVar50 = vfmadd231ps_fma(auVar47,auVar99,auVar52);
            auVar52 = vmulps_avx512vl(auVar62,auVar64);
            auVar63 = vmulps_avx512vl(auVar62,auVar63);
            auVar45 = vmulps_avx512vl(auVar62,auVar45);
            auVar52 = vfmadd231ps_avx512vl(auVar52,auVar99,auVar48);
            auVar54 = vfmadd231ps_fma(auVar63,auVar99,auVar54);
            auVar45 = vfmadd231ps_fma(auVar45,auVar99,auVar56);
            auVar63 = vmulps_avx512vl(auVar62,auVar67);
            auVar65 = vmulps_avx512vl(auVar62,auVar65);
            auVar56 = vmulps_avx512vl(auVar62,auVar42);
            auVar42 = vfmadd231ps_fma(auVar63,auVar99,auVar58);
            auVar63 = vfmadd231ps_fma(auVar65,auVar99,auVar55);
            auVar43 = vfmadd231ps_fma(auVar56,auVar99,auVar43);
            auVar68 = vinsertf32x4_avx512vl(ZEXT1632(auVar49),auVar52,1);
            auVar69 = vinsertf32x4_avx512vl(ZEXT1632(auVar57),auVar54,1);
            auVar78._16_16_ = auVar45;
            auVar78._0_16_ = auVar66;
            auVar80._16_16_ = auVar60;
            auVar80._0_16_ = auVar60;
            auVar77._16_16_ = auVar44;
            auVar77._0_16_ = auVar44;
            auVar75._16_16_ = auVar50;
            auVar75._0_16_ = auVar50;
            auVar76._16_16_ = auVar42;
            auVar76._0_16_ = auVar42;
            auVar82._16_16_ = auVar63;
            auVar82._0_16_ = auVar63;
            uVar100 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar83._4_4_ = uVar100;
            auVar83._0_4_ = uVar100;
            auVar83._8_4_ = uVar100;
            auVar83._12_4_ = uVar100;
            auVar83._16_4_ = uVar100;
            auVar83._20_4_ = uVar100;
            auVar83._24_4_ = uVar100;
            auVar83._28_4_ = uVar100;
            auVar70 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]))
            ;
            auVar74 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]))
            ;
            uVar100 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar102._4_4_ = uVar100;
            auVar102._0_4_ = uVar100;
            auVar102._8_4_ = uVar100;
            auVar102._12_4_ = uVar100;
            auVar102._16_4_ = uVar100;
            auVar102._20_4_ = uVar100;
            auVar102._24_4_ = uVar100;
            auVar102._28_4_ = uVar100;
            uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
            auVar104._4_4_ = uVar100;
            auVar104._0_4_ = uVar100;
            auVar104._8_4_ = uVar100;
            auVar104._12_4_ = uVar100;
            auVar104._16_4_ = uVar100;
            auVar104._20_4_ = uVar100;
            auVar104._24_4_ = uVar100;
            auVar104._28_4_ = uVar100;
            auVar81._16_16_ = auVar43;
            auVar81._0_16_ = auVar43;
            fVar98 = (ray->super_RayK<1>).dir.field_0.m128[2];
            auVar107._4_4_ = fVar98;
            auVar107._0_4_ = fVar98;
            auVar107._8_4_ = fVar98;
            auVar107._12_4_ = fVar98;
            auVar107._16_4_ = fVar98;
            auVar107._20_4_ = fVar98;
            auVar107._24_4_ = fVar98;
            auVar107._28_4_ = fVar98;
            auVar68 = vsubps_avx(auVar68,auVar83);
            auVar72 = vsubps_avx512vl(auVar69,auVar70);
            auVar78 = vsubps_avx512vl(auVar78,auVar74);
            auVar80 = vsubps_avx512vl(auVar80,auVar83);
            auVar77 = vsubps_avx512vl(auVar77,auVar70);
            auVar75 = vsubps_avx512vl(auVar75,auVar74);
            auVar76 = vsubps_avx512vl(auVar76,auVar83);
            auVar70 = vsubps_avx512vl(auVar82,auVar70);
            auVar81 = vsubps_avx512vl(auVar81,auVar74);
            auVar82 = vsubps_avx512vl(auVar76,auVar68);
            auVar69 = vsubps_avx(auVar70,auVar72);
            auVar83 = vsubps_avx512vl(auVar81,auVar78);
            auVar84 = vsubps_avx512vl(auVar68,auVar80);
            auVar85 = vsubps_avx512vl(auVar72,auVar77);
            auVar86 = vsubps_avx512vl(auVar78,auVar75);
            auVar71 = vaddps_avx512vl(auVar76,auVar68);
            auVar95._0_4_ = auVar70._0_4_ + auVar72._0_4_;
            auVar95._4_4_ = auVar70._4_4_ + auVar72._4_4_;
            auVar95._8_4_ = auVar70._8_4_ + auVar72._8_4_;
            auVar95._12_4_ = auVar70._12_4_ + auVar72._12_4_;
            auVar95._16_4_ = auVar70._16_4_ + auVar72._16_4_;
            auVar95._20_4_ = auVar70._20_4_ + auVar72._20_4_;
            auVar95._24_4_ = auVar70._24_4_ + auVar72._24_4_;
            auVar95._28_4_ = auVar70._28_4_ + auVar72._28_4_;
            auVar87 = vaddps_avx512vl(auVar81,auVar78);
            auVar74._4_4_ = auVar83._4_4_ * auVar95._4_4_;
            auVar74._0_4_ = auVar83._0_4_ * auVar95._0_4_;
            auVar74._8_4_ = auVar83._8_4_ * auVar95._8_4_;
            auVar74._12_4_ = auVar83._12_4_ * auVar95._12_4_;
            auVar74._16_4_ = auVar83._16_4_ * auVar95._16_4_;
            auVar74._20_4_ = auVar83._20_4_ * auVar95._20_4_;
            auVar74._24_4_ = auVar83._24_4_ * auVar95._24_4_;
            auVar74._28_4_ = auVar45._12_4_;
            auVar66 = vfmsub231ps_fma(auVar74,auVar69,auVar87);
            auVar88._4_4_ = auVar82._4_4_ * auVar87._4_4_;
            auVar88._0_4_ = auVar82._0_4_ * auVar87._0_4_;
            auVar88._8_4_ = auVar82._8_4_ * auVar87._8_4_;
            auVar88._12_4_ = auVar82._12_4_ * auVar87._12_4_;
            auVar88._16_4_ = auVar82._16_4_ * auVar87._16_4_;
            auVar88._20_4_ = auVar82._20_4_ * auVar87._20_4_;
            auVar88._24_4_ = auVar82._24_4_ * auVar87._24_4_;
            auVar88._28_4_ = auVar87._28_4_;
            auVar42 = vfmsub231ps_fma(auVar88,auVar83,auVar71);
            auVar87._4_4_ = auVar69._4_4_ * auVar71._4_4_;
            auVar87._0_4_ = auVar69._0_4_ * auVar71._0_4_;
            auVar87._8_4_ = auVar69._8_4_ * auVar71._8_4_;
            auVar87._12_4_ = auVar69._12_4_ * auVar71._12_4_;
            auVar87._16_4_ = auVar69._16_4_ * auVar71._16_4_;
            auVar87._20_4_ = auVar69._20_4_ * auVar71._20_4_;
            auVar87._24_4_ = auVar69._24_4_ * auVar71._24_4_;
            auVar87._28_4_ = auVar71._28_4_;
            auVar54 = vfmsub231ps_fma(auVar87,auVar82,auVar95);
            auVar89._0_4_ = fVar98 * auVar54._0_4_;
            auVar89._4_4_ = fVar98 * auVar54._4_4_;
            auVar89._8_4_ = fVar98 * auVar54._8_4_;
            auVar89._12_4_ = fVar98 * auVar54._12_4_;
            auVar89._16_4_ = fVar98 * 0.0;
            auVar89._20_4_ = fVar98 * 0.0;
            auVar89._24_4_ = fVar98 * 0.0;
            auVar89._28_4_ = 0;
            auVar42 = vfmadd231ps_fma(auVar89,auVar104,ZEXT1632(auVar42));
            auVar42 = vfmadd231ps_fma(ZEXT1632(auVar42),auVar102,ZEXT1632(auVar66));
            auVar74 = vaddps_avx512vl(auVar68,auVar80);
            auVar88 = vaddps_avx512vl(auVar72,auVar77);
            auVar87 = vaddps_avx512vl(auVar78,auVar75);
            auVar71 = vmulps_avx512vl(auVar88,auVar86);
            auVar89 = vfmsub231ps_avx512vl(auVar71,auVar85,auVar87);
            auVar71._4_4_ = auVar84._4_4_ * auVar87._4_4_;
            auVar71._0_4_ = auVar84._0_4_ * auVar87._0_4_;
            auVar71._8_4_ = auVar84._8_4_ * auVar87._8_4_;
            auVar71._12_4_ = auVar84._12_4_ * auVar87._12_4_;
            auVar71._16_4_ = auVar84._16_4_ * auVar87._16_4_;
            auVar71._20_4_ = auVar84._20_4_ * auVar87._20_4_;
            auVar71._24_4_ = auVar84._24_4_ * auVar87._24_4_;
            auVar71._28_4_ = auVar87._28_4_;
            auVar87 = vfmsub231ps_avx512vl(auVar71,auVar86,auVar74);
            auVar74 = vmulps_avx512vl(auVar74,auVar85);
            auVar66 = vfmsub231ps_fma(auVar74,auVar84,auVar88);
            auVar74 = vsubps_avx512vl(auVar80,auVar76);
            auVar105._0_4_ = fVar98 * auVar66._0_4_;
            auVar105._4_4_ = fVar98 * auVar66._4_4_;
            auVar105._8_4_ = fVar98 * auVar66._8_4_;
            auVar105._12_4_ = fVar98 * auVar66._12_4_;
            auVar105._16_4_ = fVar98 * 0.0;
            auVar105._20_4_ = fVar98 * 0.0;
            auVar105._24_4_ = fVar98 * 0.0;
            auVar105._28_4_ = 0;
            auVar66 = vfmadd231ps_fma(auVar105,auVar104,auVar87);
            auVar88 = vsubps_avx512vl(auVar77,auVar70);
            local_2540 = vfmadd231ps_avx512vl(ZEXT1632(auVar66),auVar102,auVar89);
            auVar87 = vsubps_avx512vl(auVar75,auVar81);
            auVar71 = vaddps_avx512vl(auVar80,auVar76);
            auVar70 = vaddps_avx512vl(auVar77,auVar70);
            auVar80 = vaddps_avx512vl(auVar75,auVar81);
            auVar77 = vmulps_avx512vl(auVar70,auVar87);
            auVar77 = vfmsub231ps_avx512vl(auVar77,auVar88,auVar80);
            auVar80 = vmulps_avx512vl(auVar80,auVar74);
            auVar80 = vfmsub231ps_avx512vl(auVar80,auVar87,auVar71);
            auVar71 = vmulps_avx512vl(auVar71,auVar88);
            auVar70 = vfmsub231ps_avx512vl(auVar71,auVar74,auVar70);
            auVar70 = vmulps_avx512vl(auVar107,auVar70);
            auVar70 = vfmadd231ps_avx512vl(auVar70,auVar104,auVar80);
            auVar71 = vfmadd231ps_avx512vl(auVar70,auVar102,auVar77);
            auVar117._0_4_ = local_2540._0_4_ + auVar42._0_4_;
            auVar117._4_4_ = local_2540._4_4_ + auVar42._4_4_;
            auVar117._8_4_ = local_2540._8_4_ + auVar42._8_4_;
            auVar117._12_4_ = local_2540._12_4_ + auVar42._12_4_;
            auVar117._16_4_ = local_2540._16_4_ + 0.0;
            auVar117._20_4_ = local_2540._20_4_ + 0.0;
            auVar117._24_4_ = local_2540._24_4_ + 0.0;
            auVar117._28_4_ = local_2540._28_4_ + 0.0;
            local_2520 = vaddps_avx512vl(auVar71,auVar117);
            auVar75 = auVar130._0_32_;
            vandps_avx512vl(local_2520,auVar75);
            auVar70._8_4_ = 0x34000000;
            auVar70._0_8_ = 0x3400000034000000;
            auVar70._12_4_ = 0x34000000;
            auVar70._16_4_ = 0x34000000;
            auVar70._20_4_ = 0x34000000;
            auVar70._24_4_ = 0x34000000;
            auVar70._28_4_ = 0x34000000;
            auVar70 = vmulps_avx512vl(local_2520,auVar70);
            auVar80 = vminps_avx512vl(ZEXT1632(auVar42),local_2540);
            auVar80 = vminps_avx512vl(auVar80,auVar71);
            auVar77 = vxorps_avx512vl(auVar70,auVar131._0_32_);
            uVar103 = vcmpps_avx512vl(auVar80,auVar77,5);
            auVar80 = vmaxps_avx512vl(ZEXT1632(auVar42),local_2540);
            auVar71 = vmaxps_avx512vl(auVar80,auVar71);
            uVar10 = vcmpps_avx512vl(auVar71,auVar70,2);
            auVar70 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x10 + lVar34));
            local_2580 = vmovdqa64_avx512vl(auVar70);
            auVar70 = vbroadcasti32x4_avx512vl(*(undefined1 (*) [16])(uVar39 + 0x14 + lVar34));
            local_26e0 = vmovdqa64_avx512vl(auVar70);
            local_24a0 = (byte)uVar103 | (byte)uVar10;
            if (local_24a0 != 0) {
              auVar70 = vmulps_avx512vl(auVar83,auVar85);
              auVar71 = vmulps_avx512vl(auVar82,auVar86);
              auVar80 = vmulps_avx512vl(auVar69,auVar84);
              auVar77 = vmulps_avx512vl(auVar86,auVar88);
              auVar76 = vmulps_avx512vl(auVar84,auVar87);
              auVar81 = vmulps_avx512vl(auVar85,auVar74);
              auVar69 = vfmsub213ps_avx512vl(auVar69,auVar86,auVar70);
              auVar83 = vfmsub213ps_avx512vl(auVar83,auVar84,auVar71);
              auVar82 = vfmsub213ps_avx512vl(auVar82,auVar85,auVar80);
              auVar87 = vfmsub213ps_avx512vl(auVar87,auVar85,auVar77);
              auVar74 = vfmsub213ps_avx512vl(auVar74,auVar86,auVar76);
              auVar88 = vfmsub213ps_avx512vl(auVar88,auVar84,auVar81);
              vandps_avx512vl(auVar70,auVar75);
              vandps_avx512vl(auVar77,auVar75);
              uVar26 = vcmpps_avx512vl(auVar88,auVar88,1);
              vandps_avx512vl(auVar71,auVar75);
              vandps_avx512vl(auVar76,auVar75);
              uVar36 = vcmpps_avx512vl(auVar88,auVar88,1);
              vandps_avx512vl(auVar80,auVar75);
              vandps_avx512vl(auVar81,auVar75);
              uVar41 = vcmpps_avx512vl(auVar88,auVar88,1);
              bVar8 = (bool)((byte)uVar26 & 1);
              local_2500._0_4_ = (float)((uint)bVar8 * auVar69._0_4_ | (uint)!bVar8 * auVar87._0_4_)
              ;
              bVar8 = (bool)((byte)(uVar26 >> 1) & 1);
              local_2500._4_4_ = (float)((uint)bVar8 * auVar69._4_4_ | (uint)!bVar8 * auVar87._4_4_)
              ;
              bVar8 = (bool)((byte)(uVar26 >> 2) & 1);
              local_2500._8_4_ = (float)((uint)bVar8 * auVar69._8_4_ | (uint)!bVar8 * auVar87._8_4_)
              ;
              bVar8 = (bool)((byte)(uVar26 >> 3) & 1);
              local_2500._12_4_ =
                   (float)((uint)bVar8 * auVar69._12_4_ | (uint)!bVar8 * auVar87._12_4_);
              bVar8 = (bool)((byte)(uVar26 >> 4) & 1);
              local_2500._16_4_ =
                   (float)((uint)bVar8 * auVar69._16_4_ | (uint)!bVar8 * auVar87._16_4_);
              bVar8 = (bool)((byte)(uVar26 >> 5) & 1);
              local_2500._20_4_ =
                   (float)((uint)bVar8 * auVar69._20_4_ | (uint)!bVar8 * auVar87._20_4_);
              bVar8 = (bool)((byte)(uVar26 >> 6) & 1);
              local_2500._24_4_ =
                   (float)((uint)bVar8 * auVar69._24_4_ | (uint)!bVar8 * auVar87._24_4_);
              bVar8 = SUB81(uVar26 >> 7,0);
              local_2500._28_4_ = (uint)bVar8 * auVar69._28_4_ | (uint)!bVar8 * auVar87._28_4_;
              bVar8 = (bool)((byte)uVar36 & 1);
              local_24e0._0_4_ = (float)((uint)bVar8 * auVar83._0_4_ | (uint)!bVar8 * auVar74._0_4_)
              ;
              bVar8 = (bool)((byte)(uVar36 >> 1) & 1);
              local_24e0._4_4_ = (float)((uint)bVar8 * auVar83._4_4_ | (uint)!bVar8 * auVar74._4_4_)
              ;
              bVar8 = (bool)((byte)(uVar36 >> 2) & 1);
              local_24e0._8_4_ = (float)((uint)bVar8 * auVar83._8_4_ | (uint)!bVar8 * auVar74._8_4_)
              ;
              bVar8 = (bool)((byte)(uVar36 >> 3) & 1);
              local_24e0._12_4_ =
                   (float)((uint)bVar8 * auVar83._12_4_ | (uint)!bVar8 * auVar74._12_4_);
              bVar8 = (bool)((byte)(uVar36 >> 4) & 1);
              local_24e0._16_4_ =
                   (float)((uint)bVar8 * auVar83._16_4_ | (uint)!bVar8 * auVar74._16_4_);
              bVar8 = (bool)((byte)(uVar36 >> 5) & 1);
              local_24e0._20_4_ =
                   (float)((uint)bVar8 * auVar83._20_4_ | (uint)!bVar8 * auVar74._20_4_);
              bVar8 = (bool)((byte)(uVar36 >> 6) & 1);
              local_24e0._24_4_ =
                   (float)((uint)bVar8 * auVar83._24_4_ | (uint)!bVar8 * auVar74._24_4_);
              bVar8 = SUB81(uVar36 >> 7,0);
              local_24e0._28_4_ = (uint)bVar8 * auVar83._28_4_ | (uint)!bVar8 * auVar74._28_4_;
              bVar8 = (bool)((byte)uVar41 & 1);
              local_24c0 = (float)((uint)bVar8 * auVar82._0_4_ | (uint)!bVar8 * auVar88._0_4_);
              bVar8 = (bool)((byte)(uVar41 >> 1) & 1);
              fStack_24bc = (float)((uint)bVar8 * auVar82._4_4_ | (uint)!bVar8 * auVar88._4_4_);
              bVar8 = (bool)((byte)(uVar41 >> 2) & 1);
              fStack_24b8 = (float)((uint)bVar8 * auVar82._8_4_ | (uint)!bVar8 * auVar88._8_4_);
              bVar8 = (bool)((byte)(uVar41 >> 3) & 1);
              fStack_24b4 = (float)((uint)bVar8 * auVar82._12_4_ | (uint)!bVar8 * auVar88._12_4_);
              bVar8 = (bool)((byte)(uVar41 >> 4) & 1);
              fStack_24b0 = (float)((uint)bVar8 * auVar82._16_4_ | (uint)!bVar8 * auVar88._16_4_);
              bVar8 = (bool)((byte)(uVar41 >> 5) & 1);
              fStack_24ac = (float)((uint)bVar8 * auVar82._20_4_ | (uint)!bVar8 * auVar88._20_4_);
              bVar8 = (bool)((byte)(uVar41 >> 6) & 1);
              fStack_24a8 = (float)((uint)bVar8 * auVar82._24_4_ | (uint)!bVar8 * auVar88._24_4_);
              bVar8 = SUB81(uVar41 >> 7,0);
              uStack_24a4 = (uint)bVar8 * auVar82._28_4_ | (uint)!bVar8 * auVar88._28_4_;
              auVar85._4_4_ = fVar98 * fStack_24bc;
              auVar85._0_4_ = fVar98 * local_24c0;
              auVar85._8_4_ = fVar98 * fStack_24b8;
              auVar85._12_4_ = fVar98 * fStack_24b4;
              auVar85._16_4_ = fVar98 * fStack_24b0;
              auVar85._20_4_ = fVar98 * fStack_24ac;
              auVar85._24_4_ = fVar98 * fStack_24a8;
              auVar85._28_4_ = fVar98;
              auVar66 = vfmadd213ps_fma(auVar104,local_24e0,auVar85);
              auVar66 = vfmadd213ps_fma(auVar102,local_2500,ZEXT1632(auVar66));
              auVar70 = ZEXT1632(CONCAT412(auVar66._12_4_ + auVar66._12_4_,
                                           CONCAT48(auVar66._8_4_ + auVar66._8_4_,
                                                    CONCAT44(auVar66._4_4_ + auVar66._4_4_,
                                                             auVar66._0_4_ + auVar66._0_4_))));
              auVar86._0_4_ = auVar78._0_4_ * local_24c0;
              auVar86._4_4_ = auVar78._4_4_ * fStack_24bc;
              auVar86._8_4_ = auVar78._8_4_ * fStack_24b8;
              auVar86._12_4_ = auVar78._12_4_ * fStack_24b4;
              auVar86._16_4_ = auVar78._16_4_ * fStack_24b0;
              auVar86._20_4_ = auVar78._20_4_ * fStack_24ac;
              auVar86._24_4_ = auVar78._24_4_ * fStack_24a8;
              auVar86._28_4_ = 0;
              auVar66 = vfmadd213ps_fma(auVar72,local_24e0,auVar86);
              auVar54 = vfmadd213ps_fma(auVar68,local_2500,ZEXT1632(auVar66));
              auVar68 = vrcp14ps_avx512vl(auVar70);
              auVar74 = auVar132._0_32_;
              auVar69 = vfnmadd213ps_avx512vl(auVar68,auVar70,auVar74);
              auVar66 = vfmadd132ps_fma(auVar69,auVar68,auVar68);
              local_2440 = ZEXT1632(CONCAT412((auVar54._12_4_ + auVar54._12_4_) * auVar66._12_4_,
                                              CONCAT48((auVar54._8_4_ + auVar54._8_4_) *
                                                       auVar66._8_4_,
                                                       CONCAT44((auVar54._4_4_ + auVar54._4_4_) *
                                                                auVar66._4_4_,
                                                                (auVar54._0_4_ + auVar54._0_4_) *
                                                                auVar66._0_4_))));
              auVar94 = ZEXT3264(local_2440);
              uVar100 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar72._4_4_ = uVar100;
              auVar72._0_4_ = uVar100;
              auVar72._8_4_ = uVar100;
              auVar72._12_4_ = uVar100;
              auVar72._16_4_ = uVar100;
              auVar72._20_4_ = uVar100;
              auVar72._24_4_ = uVar100;
              auVar72._28_4_ = uVar100;
              uVar103 = vcmpps_avx512vl(local_2440,auVar72,0xd);
              auVar68 = vxorps_avx512vl(auVar70,auVar131._0_32_);
              fVar98 = (ray->super_RayK<1>).tfar;
              auVar84._4_4_ = fVar98;
              auVar84._0_4_ = fVar98;
              auVar84._8_4_ = fVar98;
              auVar84._12_4_ = fVar98;
              auVar84._16_4_ = fVar98;
              auVar84._20_4_ = fVar98;
              auVar84._24_4_ = fVar98;
              auVar84._28_4_ = fVar98;
              uVar10 = vcmpps_avx512vl(local_2440,auVar84,2);
              uVar11 = vcmpps_avx512vl(auVar70,auVar68,4);
              local_24a0 = (byte)uVar103 & (byte)uVar10 & (byte)uVar11 & local_24a0;
              if (local_24a0 != 0) {
                local_2700 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar23 = (uint)local_24a0;
                uVar30 = vextractps_avx(local_2700._0_16_,1);
                local_2560 = ZEXT1632(auVar42);
                local_23c0 = 0xf0;
                auVar14._8_4_ = 0x219392ef;
                auVar14._0_8_ = 0x219392ef219392ef;
                auVar14._12_4_ = 0x219392ef;
                auVar14._16_4_ = 0x219392ef;
                auVar14._20_4_ = 0x219392ef;
                auVar14._24_4_ = 0x219392ef;
                auVar14._28_4_ = 0x219392ef;
                uVar26 = vcmpps_avx512vl(local_2520,auVar14,5);
                auVar68 = vrcp14ps_avx512vl(local_2520);
                auVar69 = vfnmadd213ps_avx512vl(local_2520,auVar68,auVar74);
                auVar69 = vfmadd132ps_avx512vl(auVar69,auVar68,auVar68);
                fVar115 = (float)((uint)((byte)uVar26 & 1) * auVar69._0_4_);
                fVar98 = (float)((uint)((byte)(uVar26 >> 1) & 1) * auVar69._4_4_);
                fVar114 = (float)((uint)((byte)(uVar26 >> 2) & 1) * auVar69._8_4_);
                fVar113 = (float)((uint)((byte)(uVar26 >> 3) & 1) * auVar69._12_4_);
                fVar112 = (float)((uint)((byte)(uVar26 >> 4) & 1) * auVar69._16_4_);
                fVar111 = (float)((uint)((byte)(uVar26 >> 5) & 1) * auVar69._20_4_);
                fVar110 = (float)((uint)((byte)(uVar26 >> 6) & 1) * auVar69._24_4_);
                auVar92._0_4_ = fVar115 * auVar42._0_4_;
                auVar92._4_4_ = fVar98 * auVar42._4_4_;
                auVar92._8_4_ = fVar114 * auVar42._8_4_;
                auVar92._12_4_ = fVar113 * auVar42._12_4_;
                auVar92._16_4_ = fVar112 * 0.0;
                auVar92._20_4_ = fVar111 * 0.0;
                auVar92._24_4_ = fVar110 * 0.0;
                auVar92._28_4_ = 0;
                auVar69 = vminps_avx512vl(auVar92,auVar74);
                auVar20._4_4_ = local_2540._4_4_ * fVar98;
                auVar20._0_4_ = local_2540._0_4_ * fVar115;
                auVar20._8_4_ = local_2540._8_4_ * fVar114;
                auVar20._12_4_ = local_2540._12_4_ * fVar113;
                auVar20._16_4_ = local_2540._16_4_ * fVar112;
                auVar20._20_4_ = local_2540._20_4_ * fVar111;
                auVar20._24_4_ = local_2540._24_4_ * fVar110;
                auVar20._28_4_ = auVar68._28_4_;
                auVar68 = vminps_avx512vl(auVar20,auVar74);
                auVar70 = vsubps_avx512vl(auVar74,auVar69);
                auVar74 = vsubps_avx512vl(auVar74,auVar68);
                local_2460 = vblendps_avx(auVar68,auVar70,0xf0);
                local_2480 = vblendps_avx(auVar69,auVar74,0xf0);
                local_2420[0] = local_2500._0_4_ * 1.0;
                local_2420[1] = local_2500._4_4_ * 1.0;
                local_2420[2] = local_2500._8_4_ * 1.0;
                local_2420[3] = local_2500._12_4_ * 1.0;
                fStack_2410 = local_2500._16_4_ * -1.0;
                fStack_240c = local_2500._20_4_ * -1.0;
                fStack_2408 = local_2500._24_4_ * -1.0;
                uStack_2404 = local_2480._28_4_;
                local_2400[0] = local_24e0._0_4_ * 1.0;
                local_2400[1] = local_24e0._4_4_ * 1.0;
                local_2400[2] = local_24e0._8_4_ * 1.0;
                local_2400[3] = local_24e0._12_4_ * 1.0;
                fStack_23f0 = local_24e0._16_4_ * -1.0;
                fStack_23ec = local_24e0._20_4_ * -1.0;
                fStack_23e8 = local_24e0._24_4_ * -1.0;
                uStack_23e4 = local_24e0._28_4_;
                local_23e0[0] = local_24c0 * 1.0;
                local_23e0[1] = fStack_24bc * 1.0;
                local_23e0[2] = fStack_24b8 * 1.0;
                local_23e0[3] = fStack_24b4 * 1.0;
                fStack_23d0 = fStack_24b0 * -1.0;
                fStack_23cc = fStack_24ac * -1.0;
                fStack_23c8 = fStack_24a8 * -1.0;
                uStack_23c4 = uStack_24a4;
                auVar93._8_4_ = 0x7f800000;
                auVar93._0_8_ = 0x7f8000007f800000;
                auVar93._12_4_ = 0x7f800000;
                auVar93._16_4_ = 0x7f800000;
                auVar93._20_4_ = 0x7f800000;
                auVar93._24_4_ = 0x7f800000;
                auVar93._28_4_ = 0x7f800000;
                auVar68 = vblendmps_avx512vl(auVar93,local_2440);
                auVar90._0_4_ =
                     (uint)(local_24a0 & 1) * auVar68._0_4_ |
                     (uint)!(bool)(local_24a0 & 1) * 0x7f800000;
                bVar8 = (bool)(local_24a0 >> 1 & 1);
                auVar90._4_4_ = (uint)bVar8 * auVar68._4_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_24a0 >> 2 & 1);
                auVar90._8_4_ = (uint)bVar8 * auVar68._8_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_24a0 >> 3 & 1);
                auVar90._12_4_ = (uint)bVar8 * auVar68._12_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_24a0 >> 4 & 1);
                auVar90._16_4_ = (uint)bVar8 * auVar68._16_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_24a0 >> 5 & 1);
                auVar90._20_4_ = (uint)bVar8 * auVar68._20_4_ | (uint)!bVar8 * 0x7f800000;
                bVar8 = (bool)(local_24a0 >> 6 & 1);
                auVar90._24_4_ = (uint)bVar8 * auVar68._24_4_ | (uint)!bVar8 * 0x7f800000;
                auVar90._28_4_ =
                     (uint)(local_24a0 >> 7) * auVar68._28_4_ |
                     (uint)!(bool)(local_24a0 >> 7) * 0x7f800000;
                auVar68 = vshufps_avx(auVar90,auVar90,0xb1);
                auVar68 = vminps_avx(auVar90,auVar68);
                auVar69 = vshufpd_avx(auVar68,auVar68,5);
                auVar68 = vminps_avx(auVar68,auVar69);
                auVar69 = vpermpd_avx2(auVar68,0x4e);
                auVar68 = vminps_avx(auVar68,auVar69);
                uVar103 = vcmpps_avx512vl(auVar90,auVar68,0);
                bVar21 = local_24a0;
                if (((byte)uVar103 & local_24a0) != 0) {
                  bVar21 = (byte)uVar103 & local_24a0;
                }
                do {
                  auVar68 = auVar94._0_32_;
                  uVar13 = 0;
                  for (uVar22 = (uint)bVar21; (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000)
                  {
                    uVar13 = uVar13 + 1;
                  }
                  uVar22 = *(uint *)(local_2580 + (ulong)uVar13 * 4);
                  pGVar4 = (local_27b8->geometries).items[uVar22].ptr;
                  if ((pGVar4->mask & uVar30) == 0) {
                    uVar23 = (uint)(byte)(~(byte)(1 << (uVar13 & 0x1f)) & (byte)uVar23);
                  }
                  else {
                    pRVar7 = local_27c0->args;
                    if (pRVar7->filter == (RTCFilterFunctionN)0x0) {
                      pRVar29 = local_27c0->user;
                      if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar26 = (ulong)(uVar13 << 2);
                        fVar98 = *(float *)(local_2480 + uVar26);
                        fVar110 = *(float *)(local_2460 + uVar26);
                        (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar26);
                        (ray->Ng).field_0.field_0.x = *(float *)((long)local_2420 + uVar26);
                        (ray->Ng).field_0.field_0.y = *(float *)((long)local_2400 + uVar26);
                        (ray->Ng).field_0.field_0.z = *(float *)((long)local_23e0 + uVar26);
                        ray->u = fVar98;
                        ray->v = fVar110;
                        ray->primID = *(uint *)(local_26e0 + uVar26);
                        ray->geomID = uVar22;
                        ray->instID[0] = pRVar29->instID[0];
                        ray->instPrimID[0] = pRVar29->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      pRVar29 = local_27c0->user;
                    }
                    uVar26 = (ulong)(uVar13 * 4);
                    local_2730 = *(float *)((long)local_2420 + uVar26);
                    local_272c = *(undefined4 *)((long)local_2400 + uVar26);
                    local_2728 = *(undefined4 *)((long)local_23e0 + uVar26);
                    local_2724 = *(undefined4 *)(local_2480 + uVar26);
                    local_2720 = *(undefined4 *)(local_2460 + uVar26);
                    local_271c = *(undefined4 *)(local_26e0 + uVar26);
                    local_2718 = uVar22;
                    local_2714 = pRVar29->instID[0];
                    local_2710 = pRVar29->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_2440 + uVar26);
                    local_27c4 = -1;
                    local_27b0.valid = &local_27c4;
                    local_27b0.geometryUserPtr = pGVar4->userPtr;
                    local_27b0.context = pRVar29;
                    local_27b0.ray = (RTCRayN *)ray;
                    local_27b0.hit = (RTCHitN *)&local_2730;
                    local_27b0.N = 1;
                    local_2760 = pGVar4;
                    local_2780 = auVar68;
                    if (pGVar4->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f2b4bc:
                      if ((pRVar7->filter != (RTCFilterFunctionN)0x0) &&
                         (((pRVar7->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_2760->field_8).field_0x2 & 0x40) != 0)))) {
                        (*pRVar7->filter)(&local_27b0);
                        auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar132 = ZEXT3264(auVar68);
                        auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                        auVar131 = ZEXT3264(auVar68);
                        auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                        auVar130 = ZEXT3264(auVar68);
                        if (*local_27b0.valid == 0) goto LAB_01f2b578;
                      }
                      (((Vec3f *)((long)local_27b0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_27b0.hit;
                      (((Vec3f *)((long)local_27b0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_27b0.hit + 4);
                      (((Vec3f *)((long)local_27b0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_27b0.hit + 8);
                      *(float *)((long)local_27b0.ray + 0x3c) = *(float *)(local_27b0.hit + 0xc);
                      *(float *)((long)local_27b0.ray + 0x40) = *(float *)(local_27b0.hit + 0x10);
                      *(float *)((long)local_27b0.ray + 0x44) = *(float *)(local_27b0.hit + 0x14);
                      *(float *)((long)local_27b0.ray + 0x48) = *(float *)(local_27b0.hit + 0x18);
                      *(float *)((long)local_27b0.ray + 0x4c) = *(float *)(local_27b0.hit + 0x1c);
                      *(float *)((long)local_27b0.ray + 0x50) = *(float *)(local_27b0.hit + 0x20);
                    }
                    else {
                      (*pGVar4->intersectionFilterN)(&local_27b0);
                      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar132 = ZEXT3264(auVar68);
                      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                      auVar131 = ZEXT3264(auVar68);
                      auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                      auVar130 = ZEXT3264(auVar68);
                      if (*local_27b0.valid != 0) goto LAB_01f2b4bc;
LAB_01f2b578:
                      (ray->super_RayK<1>).tfar = (float)local_2700._0_4_;
                    }
                    fVar98 = (ray->super_RayK<1>).tfar;
                    auVar15._4_4_ = fVar98;
                    auVar15._0_4_ = fVar98;
                    auVar15._8_4_ = fVar98;
                    auVar15._12_4_ = fVar98;
                    auVar15._16_4_ = fVar98;
                    auVar15._20_4_ = fVar98;
                    auVar15._24_4_ = fVar98;
                    auVar15._28_4_ = fVar98;
                    uVar103 = vcmpps_avx512vl(local_2780,auVar15,2);
                    uVar23 = (uint)(byte)(~(byte)(1 << (uVar13 & 0x1f)) & (byte)uVar23) &
                             (uint)uVar103;
                    uVar30 = (ray->super_RayK<1>).mask;
                    local_2700 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
                    auVar68 = local_2780;
                  }
                  if ((char)uVar23 == '\0') break;
                  local_2780 = auVar68;
                  BVHNIntersector1<8,16777232,true,embree::avx512::ArrayIntersector1<embree::avx512::QuadMiMBIntersector1Pluecker<4,true>>>
                  ::intersect();
                  auVar94 = ZEXT3264(local_2780);
                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                  auVar132 = ZEXT3264(auVar68);
                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                  auVar131 = ZEXT3264(auVar68);
                  auVar68 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                  auVar130 = ZEXT3264(auVar68);
                  bVar21 = (byte)local_27b0.valid;
                } while( true );
              }
            }
            local_2738 = local_2738 + 1;
          } while (local_2738 != local_2740);
        }
        fVar98 = (ray->super_RayK<1>).tfar;
        auVar94 = ZEXT3264(CONCAT428(fVar98,CONCAT424(fVar98,CONCAT420(fVar98,CONCAT416(fVar98,
                                                  CONCAT412(fVar98,CONCAT48(fVar98,CONCAT44(fVar98,
                                                  fVar98))))))));
        auVar96 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar106 = ZEXT3264(local_25a0);
        auVar108 = ZEXT3264(local_25c0);
        auVar109 = ZEXT3264(local_25e0);
        auVar116 = ZEXT3264(local_2620);
        auVar118 = ZEXT3264(local_2640);
        auVar125 = ZEXT3264(local_2680);
        auVar126 = ZEXT3264(local_26a0);
        auVar127 = ZEXT3264(local_26c0);
        auVar68 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
        auVar128 = ZEXT3264(auVar68);
        auVar68 = vbroadcastss_avx512vl(ZEXT416(0xfffffff8));
        auVar129 = ZEXT3264(auVar68);
        uVar26 = local_2750;
        uVar36 = local_2758;
        fVar98 = local_2600;
        fVar110 = fStack_25fc;
        fVar111 = fStack_25f8;
        fVar112 = fStack_25f4;
        fVar113 = fStack_25f0;
        fVar114 = fStack_25ec;
        fVar115 = fStack_25e8;
        fVar91 = local_2660;
        fVar119 = fStack_265c;
        fVar120 = fStack_2658;
        fVar121 = fStack_2654;
        fVar122 = fStack_2650;
        fVar123 = fStack_264c;
        fVar124 = fStack_2648;
      }
LAB_01f2b6f3:
    } while (local_2748 != &local_23a0);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }